

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O0

float rsg::interpolateFragment(Vec4 *quad,float x,float y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float y_local;
  float x_local;
  Vec4 *quad_local;
  
  if (1.0 <= x + y) {
    fVar1 = tcu::Vector<float,_4>::w(quad);
    fVar2 = tcu::Vector<float,_4>::z(quad);
    fVar3 = tcu::Vector<float,_4>::y(quad);
    quad_local._4_4_ = interpolateTri(fVar1,fVar2,fVar3,1.0 - x,1.0 - y);
  }
  else {
    fVar1 = tcu::Vector<float,_4>::x(quad);
    fVar2 = tcu::Vector<float,_4>::y(quad);
    fVar3 = tcu::Vector<float,_4>::z(quad);
    quad_local._4_4_ = interpolateTri(fVar1,fVar2,fVar3,x,y);
  }
  return quad_local._4_4_;
}

Assistant:

inline float interpolateFragment (const tcu::Vec4& quad, float x, float y)
{
	if (x + y < 1.0f)
		return interpolateTri(quad.x(), quad.y(), quad.z(), x, y);
	else
		return interpolateTri(quad.w(), quad.z(), quad.y(), 1.0f-x, 1.0f-y);
}